

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

Normalizer2 * icu_63::Normalizer2::getNFKDInstance(UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  long lVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_initOnce<char_const*>((UInitOnce *)&nfkcInitOnce,initSingletons,"nfkc",errorCode);
    lVar2 = nfkcSingleton;
  }
  else {
    lVar2 = 0;
  }
  pNVar1 = (Normalizer2 *)(lVar2 + 0x20);
  if (lVar2 == 0) {
    pNVar1 = (Normalizer2 *)0x0;
  }
  return pNVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }